

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  pointer pMVar1;
  size_t sVar2;
  void *pvVar3;
  iterator __position;
  Mat *this_01;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar6;
  int iVar7;
  undefined4 *puVar8;
  int iVar9;
  ulong uVar10;
  BBoxRect *__args;
  float *pfVar11;
  float *pfVar12;
  pointer piVar13;
  undefined4 uVar14;
  ulong uVar15;
  Yolov3DetectionOutput *this_02;
  uint _h;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar22 [12];
  long lVar19;
  float *pfVar20;
  float fVar21;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar27;
  undefined1 auVar26 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  undefined1 local_1b8 [8];
  BBoxRect *pBStack_1b0;
  BBoxRect *local_1a8;
  void *local_198;
  long local_190;
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  pointer local_130;
  pointer local_128;
  float *local_120;
  pointer local_118;
  Yolov3DetectionOutput *local_110;
  float local_108;
  float fStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e0;
  Option *local_d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_d0;
  size_t local_c8;
  long local_c0;
  pointer local_b8;
  long local_b0;
  void *local_a8;
  pointer local_a0;
  void *local_98;
  float *local_90;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_168._0_8_ = (pointer)0x0;
  local_168._8_8_ = (pointer)0x0;
  local_168._16_8_ = 0;
  this_02 = this;
  local_e0 = top_blobs;
  local_d8 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_198 = (void *)0x0;
    local_110 = this;
    local_d0 = bottom_blobs;
    do {
      pvVar6 = local_d0;
      local_1b8 = (undefined1  [8])0x0;
      pBStack_1b0 = (BBoxRect *)0x0;
      local_1a8 = (BBoxRect *)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                *)local_1b8,(long)this_02->num_box);
      pMVar1 = (pvVar6->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = this_02->num_box;
      iVar7 = pMVar1[(long)local_198].c / iVar9;
      if (iVar7 != this_02->num_class + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   *)local_1b8);
        iVar9 = -1;
        goto LAB_0043bce1;
      }
      if (0 < iVar9) {
        local_b8 = pMVar1 + (long)local_198;
        uVar18._0_4_ = local_b8->w;
        uVar18._4_4_ = local_b8->h;
        local_68._0_4_ = (float)(int)(undefined4)uVar18;
        local_68._4_4_ = (undefined4)(int)uVar18._4_4_;
        fVar21 = *(float *)((long)(this_02->anchors_scale).data + (long)local_198 * 4);
        local_130 = (pointer)(ulong)(uint)uVar18._4_4_;
        local_128 = (pointer)(uVar18 & 0xffffffff);
        local_88._0_4_ = (undefined4)(int)(fVar21 * local_68._0_4_);
        local_88._4_4_ = (undefined4)(int)(fVar21 * (float)local_68._4_4_);
        local_88._8_4_ = (float)(int)(fVar21 * 0.0);
        local_88._12_4_ = (float)(int)(fVar21 * 0.0);
        local_c8 = (size_t)iVar7;
        register0x000012c8 = 0x3f0000003f000000;
        auVar23 = rcpps(local_88,_local_68);
        local_78 = auVar23._0_4_;
        fStack_74 = auVar23._4_4_;
        fStack_70 = auVar23._8_4_;
        fStack_6c = auVar23._12_4_;
        local_78 = (1.0 - local_68._0_4_ * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)local_68._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (1.0 - fStack_70 * 0.5) * fStack_70 + fStack_70;
        fStack_6c = (1.0 - fStack_6c * 0.5) * fStack_6c + fStack_6c;
        local_c0 = (long)iVar9 * (long)local_198 * 4;
        local_190 = 0;
        do {
          if (0 < (int)local_130) {
            lVar19 = local_190 * local_c8;
            sVar2 = local_b8->cstep;
            pvVar3 = local_b8->data;
            uVar18 = local_b8->elemsize;
            local_a8 = (void *)((lVar19 + 5) * sVar2 * uVar18 + (long)pvVar3);
            local_b0 = (long)local_b8->w * uVar18;
            uVar16 = (long)local_b8->d * (long)local_b8->h * local_b0 + 0xfU & 0xfffffffffffffff0;
            pfVar11 = (float *)((lVar19 + 4) * sVar2 * uVar18 + (long)pvVar3);
            local_118 = (pointer)((lVar19 + 3) * sVar2 * uVar18 + (long)pvVar3);
            local_120 = (float *)((lVar19 + 2) * sVar2 * uVar18 + (long)pvVar3);
            pfVar12 = (float *)((lVar19 + 1) * sVar2 * uVar18 + (long)pvVar3);
            pfVar20 = (float *)(lVar19 * sVar2 * uVar18 + (long)pvVar3);
            register0x00001248 =
                 *(undefined8 *)
                  ((long)(this_02->biases).data +
                  (long)((int)*(float *)((long)(this_02->mask).data + local_190 * 4 + local_c0) * 2)
                  * 4);
            local_58 = 0x3f8000003f800000;
            piVar13 = (pointer)0x0;
            do {
              local_a0 = piVar13;
              if (0 < (int)local_128) {
                local_48 = (float)(int)piVar13;
                local_98 = (void *)(local_b0 * (long)piVar13 + (long)local_a8);
                fStack_40 = (float)local_88._0_4_;
                fStack_3c = (float)local_88._4_4_;
                piVar13 = (pointer)0x0;
                fStack_44 = local_48;
                do {
                  if ((long)this_02->num_class < 1) {
                    uVar14 = 0;
                    auVar22 = ZEXT812(0xff7fffff);
                  }
                  else {
                    uVar10 = 0;
                    uVar15 = 0;
                    auVar22 = ZEXT812(0xff7fffff);
                    do {
                      fVar21 = *(float *)((long)local_98 +
                                         (uVar16 - uVar16 % uVar18) * uVar10 + (long)piVar13 * 4);
                      fVar34 = auVar22._0_4_;
                      if (fVar34 < fVar21) {
                        uVar15 = uVar10 & 0xffffffff;
                      }
                      uVar14 = (undefined4)uVar15;
                      if (fVar21 <= fVar34) {
                        fVar21 = fVar34;
                      }
                      auVar22._4_8_ = 0;
                      auVar22._0_4_ = fVar21;
                      uVar10 = uVar10 + 1;
                    } while ((long)this_02->num_class != uVar10);
                  }
                  local_f8._12_4_ = 0;
                  local_f8._0_12_ = auVar22;
                  local_148 = expf(-*pfVar11);
                  fVar21 = expf(-local_f8._0_4_);
                  fVar21 = 1.0 / ((fVar21 + 1.0) * local_148 + 1.0);
                  if (local_110->confidence_threshold <= fVar21) {
                    auVar30 = ZEXT416((uint)*pfVar12);
                    local_108 = -*pfVar20;
                    fStack_104 = -*pfVar12;
                    uStack_100 = 0x80000000;
                    uStack_fc = 0x80000000;
                    local_f8._0_4_ = fVar21;
                    local_90 = pfVar11;
                    local_148 = expf(local_108);
                    fStack_144 = extraout_XMM0_Db;
                    fVar21 = expf(fStack_104);
                    local_148 = local_148 + 1.0;
                    fStack_140 = fStack_144 + 0.0;
                    fStack_13c = extraout_XMM0_Db_00 + 0.0;
                    fStack_144 = fVar21 + 1.0;
                    local_108 = expf(*local_120);
                    fVar21 = expf(*(float *)&local_118->data);
                    local_188._0_4_ = local_f8._0_4_;
                    auVar23._4_4_ = fStack_144;
                    auVar23._0_4_ = local_148;
                    auVar23._8_4_ = fStack_140;
                    auVar23._12_4_ = fStack_13c;
                    auVar23 = rcpps(auVar30,auVar23);
                    auVar29._0_4_ = (float)local_58._0_4_ * auVar23._0_4_;
                    auVar29._4_4_ = (float)local_58._4_4_ * auVar23._4_4_;
                    auVar29._8_4_ = fStack_50 * auVar23._8_4_;
                    auVar29._12_4_ = fStack_4c * auVar23._12_4_;
                    fVar24 = ((float)local_58._4_4_ - fStack_144 * auVar29._4_4_) * auVar23._4_4_ +
                             auVar29._4_4_;
                    auVar4._4_8_ = auVar23._8_8_;
                    auVar4._0_4_ = fStack_44;
                    auVar30._0_8_ = auVar4._0_8_ << 0x20;
                    auVar30._8_4_ = fStack_40;
                    auVar30._12_4_ = fStack_3c;
                    auVar26._4_12_ = auVar30._4_12_;
                    auVar26._0_4_ = (float)(int)piVar13;
                    auVar30 = rcpps(auVar29,auVar26);
                    fVar33 = fVar24 * auVar30._4_4_;
                    local_188._20_4_ = local_108 * fStack_50 * auVar30._8_4_;
                    fVar34 = fVar21 * fStack_4c * auVar30._12_4_;
                    local_188._20_4_ =
                         (local_108 * fStack_50 - fStack_40 * (float)local_188._20_4_) *
                         auVar30._8_4_ + (float)local_188._20_4_;
                    fVar34 = (fVar21 * fStack_4c - fStack_3c * fVar34) * auVar30._12_4_ + fVar34;
                    fVar21 = (((float)local_58._0_4_ - local_148 * auVar29._0_4_) * auVar23._0_4_ +
                              auVar29._0_4_ + auVar26._0_4_) * local_78;
                    fVar25 = (fVar24 + fStack_44) * fStack_74;
                    fVar27 = (float)local_188._20_4_ * fStack_60;
                    fVar28 = fVar34 * fStack_5c;
                    auVar31._4_4_ = fVar28;
                    auVar31._0_4_ = fVar27;
                    auVar31._8_4_ = fVar21;
                    auVar31._12_4_ = fVar25;
                    local_188._4_4_ = fVar21 - fVar27;
                    local_188._8_4_ = fVar25 - fVar28;
                    auVar5._4_8_ = auVar31._8_8_;
                    auVar5._0_4_ = fVar28 + ((fVar24 - fStack_44 * fVar33) * auVar30._4_4_ + fVar33)
                                            * (float)local_68._4_4_;
                    auVar32._0_8_ = auVar5._0_8_ << 0x20;
                    auVar32._8_4_ = fVar21 + fVar27;
                    auVar32._12_4_ = fVar25 + fVar28;
                    local_188._20_4_ = (float)local_188._20_4_ * fVar34;
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)((long)local_1b8 + local_190 * 0x18);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_188._12_4_ = auVar32._8_4_;
                    local_188._16_4_ = auVar32._12_4_;
                    local_188._24_4_ = uVar14;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,(BBoxRect *)local_188);
                      pfVar11 = local_90;
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar32._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar32._8_8_ >> 0x20);
                      (__position._M_current)->area = (float)local_188._20_4_;
                      (__position._M_current)->label = uVar14;
                      (__position._M_current)->score = (float)local_f8._0_4_;
                      (__position._M_current)->xmin = (float)local_188._4_4_;
                      (__position._M_current)->ymin = (float)local_188._8_4_;
                      (__position._M_current)->xmax = auVar32._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                      pfVar11 = local_90;
                    }
                  }
                  pfVar20 = pfVar20 + 1;
                  pfVar12 = pfVar12 + 1;
                  local_120 = local_120 + 1;
                  local_118 = (pointer)((long)&local_118->data + 4);
                  pfVar11 = pfVar11 + 1;
                  piVar13 = (pointer)((long)piVar13 + 1);
                  this_02 = local_110;
                } while (piVar13 != local_128);
              }
              piVar13 = (pointer)((long)local_a0 + 1);
            } while (piVar13 != local_130);
            iVar9 = this_02->num_box;
          }
          local_190 = local_190 + 1;
        } while (local_190 < iVar9);
        if (0 < iVar9) {
          lVar19 = 8;
          lVar17 = 0;
          do {
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                      ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                        *)local_168,local_168._8_8_,*(undefined8 *)((long)local_1b8 + lVar19 + -8),
                       *(undefined8 *)
                        ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                   *)local_1b8)->_M_impl).super__Vector_impl_data._M_start + lVar19)
                      );
            lVar17 = lVar17 + 1;
            lVar19 = lVar19 + 0x18;
          } while (lVar17 < this_02->num_box);
        }
      }
      this = (Yolov3DetectionOutput *)local_1b8;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)local_1b8);
      local_198 = (void *)((long)local_198 + 1);
    } while (local_198 <
             (void *)(((long)(local_d0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_d0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
    if (local_168._0_8_ != local_168._8_8_) {
      this = this_02;
      qsort_descent_inplace
                (this_02,(vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          *)local_168,0,
                 (int)((ulong)(local_168._8_8_ - local_168._0_8_) >> 2) * -0x49249249 + -1);
    }
  }
  local_188._0_4_ = 0.0;
  local_188._4_4_ = 0.0;
  local_188._8_4_ = 0.0;
  local_188._12_4_ = 0.0;
  local_188._16_4_ = 0.0;
  local_188._20_4_ = 0.0;
  nms_sorted_bboxes(this,(vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          *)local_168,
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,
                    this_02->nms_threshold);
  local_1b8 = (undefined1  [8])0x0;
  pBStack_1b0 = (BBoxRect *)0x0;
  local_1a8 = (BBoxRect *)0x0;
  lVar19 = CONCAT44(local_188._4_4_,local_188._0_4_);
  lVar17 = CONCAT44(local_188._12_4_,local_188._8_4_);
  if (lVar17 == lVar19) {
    iVar9 = 0;
  }
  else {
    uVar18 = 0;
    do {
      __args = (BBoxRect *)(local_168._0_8_ + *(long *)(lVar19 + uVar18 * 8) * 0x1c);
      if (pBStack_1b0 == local_1a8) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)local_1b8,(iterator)pBStack_1b0,__args);
        lVar19 = CONCAT44(local_188._4_4_,local_188._0_4_);
        lVar17 = CONCAT44(local_188._12_4_,local_188._8_4_);
      }
      else {
        fVar24 = __args->score;
        fVar25 = __args->xmin;
        fVar27 = __args->ymin;
        fVar28 = __args->xmax;
        fVar21 = __args->ymax;
        fVar34 = __args->area;
        iVar9 = __args->label;
        pBStack_1b0->xmax = __args->xmax;
        pBStack_1b0->ymax = fVar21;
        pBStack_1b0->area = fVar34;
        pBStack_1b0->label = iVar9;
        pBStack_1b0->score = fVar24;
        pBStack_1b0->xmin = fVar25;
        pBStack_1b0->ymin = fVar27;
        pBStack_1b0->xmax = fVar28;
        pBStack_1b0 = pBStack_1b0 + 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)(lVar17 - lVar19 >> 3));
    _h = (int)((long)pBStack_1b0 - (long)local_1b8 >> 2) * -0x49249249;
    iVar9 = 0;
    if (_h != 0) {
      this_01 = (local_e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_01,6,_h,4,local_d8->blob_allocator);
      iVar9 = -100;
      if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
         (iVar9 = 0, 0 < (int)_h)) {
        iVar7 = this_01->w;
        sVar2 = this_01->elemsize;
        puVar8 = (undefined4 *)((long)this_01->data + 0x14);
        iVar9 = 0;
        lVar19 = 0;
        do {
          uVar14 = *(undefined4 *)
                    ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               *)local_1b8)->_M_impl).super__Vector_impl_data._M_start + lVar19);
          puVar8[-5] = (float)*(int *)((long)&(((pointer)((long)local_1b8 + 0x18))->
                                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                              )._M_impl.super__Vector_impl_data._M_start + lVar19) +
                       1.0;
          puVar8[-4] = uVar14;
          puVar8[-3] = *(undefined4 *)
                        ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                   *)local_1b8)->_M_impl).super__Vector_impl_data._M_start +
                        lVar19 + 4);
          puVar8[-2] = *(undefined4 *)
                        ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                   *)local_1b8)->_M_impl).super__Vector_impl_data._M_finish + lVar19
                        );
          puVar8[-1] = *(undefined4 *)
                        ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                   *)local_1b8)->_M_impl).super__Vector_impl_data._M_finish +
                        lVar19 + 4);
          *puVar8 = *(undefined4 *)
                     ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                *)local_1b8)->_M_impl).super__Vector_impl_data._M_end_of_storage +
                     lVar19);
          lVar19 = lVar19 + 0x1c;
          puVar8 = (undefined4 *)((long)puVar8 + (long)iVar7 * sVar2);
        } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar19);
      }
    }
  }
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  pvVar3 = (void *)CONCAT44(local_188._4_4_,local_188._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,CONCAT44(local_188._20_4_,local_188._16_4_) - (long)pvVar3);
  }
LAB_0043bce1:
  if ((pointer)local_168._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ - local_168._0_8_);
  }
  return iVar9;
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}